

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int testnext(LexState *ls,int c)

{
  bool bVar1;
  int c_local;
  LexState *ls_local;
  
  bVar1 = (ls->t).token == c;
  if (bVar1) {
    luaX_next(ls);
  }
  ls_local._4_4_ = (uint)bVar1;
  return ls_local._4_4_;
}

Assistant:

static int testnext(LexState*ls,int c){
if(ls->t.token==c){
luaX_next(ls);
return 1;
}
else return 0;
}